

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toplevel_unit.c
# Opt level: O0

void test_intersection_bitset_x_bitset(void)

{
  roaring_bitmap_t *r;
  roaring_bitmap_t *file;
  uint64_t uVar1;
  roaring_bitmap_t *r1_and_r2;
  roaring_bitmap_t *in_stack_00000010;
  uint32_t i;
  roaring_bitmap_t *r2;
  roaring_bitmap_t *r1;
  roaring_bitmap_t *in_stack_00000028;
  roaring_bitmap_t *in_stack_00000030;
  undefined8 in_stack_ffffffffffffffd8;
  int line;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  uint uVar2;
  unsigned_long in_stack_fffffffffffffff0;
  
  roaring_bitmap_create();
  _assert_true(in_stack_fffffffffffffff0,
               (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  r = roaring_bitmap_create();
  _assert_true((unsigned_long)r,
               (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  for (uVar2 = 0; uVar2 < 20000; uVar2 = uVar2 + 1) {
    roaring_bitmap_add(r1,r2._4_4_);
    roaring_bitmap_add(r1,r2._4_4_);
    roaring_bitmap_add(r1,r2._4_4_);
    roaring_bitmap_add(r1,r2._4_4_);
    roaring_bitmap_add(r1,r2._4_4_);
    roaring_bitmap_add(r1,r2._4_4_);
    roaring_bitmap_get_cardinality(r);
    _assert_int_equal((unsigned_long)r,CONCAT44(uVar2,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
    roaring_bitmap_get_cardinality(r);
    _assert_int_equal((unsigned_long)r,CONCAT44(uVar2,in_stack_ffffffffffffffe8),
                      in_stack_ffffffffffffffe0,(int)((ulong)in_stack_ffffffffffffffd8 >> 0x20));
  }
  file = roaring_bitmap_and(in_stack_00000030,in_stack_00000028);
  uVar1 = roaring_bitmap_get_cardinality(r);
  line = (int)(uVar1 >> 0x20);
  roaring_bitmap_and_cardinality(in_stack_00000010,r1_and_r2);
  _assert_true((unsigned_long)r,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),(char *)file,line)
  ;
  _assert_true((unsigned_long)r,(char *)CONCAT44(uVar2,in_stack_ffffffffffffffe8),(char *)file,line)
  ;
  roaring_bitmap_get_cardinality(r);
  _assert_int_equal((unsigned_long)r,CONCAT44(uVar2,in_stack_ffffffffffffffe8),(char *)file,line);
  roaring_bitmap_free((roaring_bitmap_t *)0x110fcb);
  roaring_bitmap_free((roaring_bitmap_t *)0x110fd5);
  roaring_bitmap_free((roaring_bitmap_t *)0x110fdf);
  return;
}

Assistant:

DEFINE_TEST(test_intersection_bitset_x_bitset) {
    roaring_bitmap_t *r1 = roaring_bitmap_create();
    assert_true(r1);
    roaring_bitmap_t *r2 = roaring_bitmap_create();
    assert_true(r2);

    for (uint32_t i = 0; i < 20000; ++i) {
        roaring_bitmap_add(r1, 2 * i);
        roaring_bitmap_add(r2, 3 * i);
        roaring_bitmap_add(r2, 3 * i + 1);
        roaring_bitmap_add(r1, 5 * 65536 + 2 * i);
        roaring_bitmap_add(r2, 5 * 65536 + 3 * i);
        roaring_bitmap_add(r2, 5 * 65536 + 3 * i + 1);

        assert_int_equal(roaring_bitmap_get_cardinality(r1), 2 * (i + 1));
        assert_int_equal(roaring_bitmap_get_cardinality(r2), 4 * (i + 1));
    }

    roaring_bitmap_t *r1_and_r2 = roaring_bitmap_and(r1, r2);
    assert_true(roaring_bitmap_get_cardinality(r1_and_r2) ==
                roaring_bitmap_and_cardinality(r1, r2));

    assert_non_null(r1_and_r2);

    // NOT analytically determined but seems reasonable
    assert_int_equal(roaring_bitmap_get_cardinality(r1_and_r2), 26666);

    roaring_bitmap_free(r1_and_r2);
    roaring_bitmap_free(r2);
    roaring_bitmap_free(r1);
}